

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

void __thiscall
brotli::HashLongestMatchQuickly<16,_1,_true>::InitForData
          (HashLongestMatchQuickly<16,_1,_true> *this,uint8_t *data,size_t num)

{
  uint32_t uVar1;
  ulong uStack_28;
  uint32_t key;
  size_t i;
  size_t num_local;
  uint8_t *data_local;
  HashLongestMatchQuickly<16,_1,_true> *this_local;
  
  for (uStack_28 = 0; uStack_28 < num; uStack_28 = uStack_28 + 1) {
    uVar1 = HashBytes(data + uStack_28);
    memset(this->buckets_ + uVar1,0,4);
    this->need_init_ = false;
  }
  return;
}

Assistant:

void InitForData(const uint8_t* data, size_t num) {
    for (size_t i = 0; i < num; ++i) {
      const uint32_t key = HashBytes(&data[i]);
      memset(&buckets_[key], 0, kBucketSweep * sizeof(buckets_[0]));
      need_init_ = false;
    }
  }